

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_catalog_entry.cpp
# Opt level: O2

SimilarCatalogEntry * __thiscall
duckdb::SchemaCatalogEntry::GetSimilarEntry
          (SimilarCatalogEntry *__return_storage_ptr__,SchemaCatalogEntry *this,
          CatalogTransaction transaction,EntryLookupInfo *lookup_info)

{
  CatalogType CVar1;
  ClientContext *pCVar2;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->score = 0.0;
  (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
  pCVar2 = CatalogTransaction::GetContext(&transaction);
  CVar1 = EntryLookupInfo::GetCatalogType(lookup_info);
  local_28 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/catalog_entry/schema_catalog_entry.cpp:33:63)>
             ::_M_invoke;
  local_30 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/catalog_entry/schema_catalog_entry.cpp:33:63)>
             ::_M_manager;
  local_40._M_unused._M_object = lookup_info;
  local_40._8_8_ = __return_storage_ptr__;
  (*(this->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
            (this,pCVar2,(ulong)CVar1);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

SimilarCatalogEntry SchemaCatalogEntry::GetSimilarEntry(CatalogTransaction transaction,
                                                        const EntryLookupInfo &lookup_info) {
	SimilarCatalogEntry result;
	Scan(transaction.GetContext(), lookup_info.GetCatalogType(), [&](CatalogEntry &entry) {
		auto entry_score = StringUtil::SimilarityRating(entry.name, lookup_info.GetEntryName());
		if (entry_score > result.score) {
			result.score = entry_score;
			result.name = entry.name;
		}
	});
	return result;
}